

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tsPacket.cpp
# Opt level: O1

void __thiscall MPLSStreamInfo::parseStreamEntry(MPLSStreamInfo *this,BitStreamReader *reader)

{
  uint uVar1;
  uint num;
  
  num = 8;
  BitStreamReader::skipBits(reader,8);
  uVar1 = BitStreamReader::getBits(reader,8);
  this->type = (uint8_t)uVar1;
  uVar1 = uVar1 & 0xff;
  if (uVar1 - 3 < 2) {
    BitStreamReader::skipBits(reader,8);
  }
  else {
    if (uVar1 == 2) {
      BitStreamReader::skipBits(reader,0x10);
      uVar1 = BitStreamReader::getBits(reader,0x10);
      (this->super_M2TSStreamInfo).streamPID = uVar1;
      num = 0x20;
      goto LAB_001e6c31;
    }
    if (uVar1 != 1) {
      return;
    }
    num = 0x10;
  }
  uVar1 = BitStreamReader::getBits(reader,0x10);
  (this->super_M2TSStreamInfo).streamPID = uVar1;
  BitStreamReader::skipBits(reader,0x20);
LAB_001e6c31:
  BitStreamReader::skipBits(reader,num);
  return;
}

Assistant:

void MPLSStreamInfo::parseStreamEntry(BitStreamReader& reader)
{
    reader.skipBits(8);  // length
    type = reader.getBits<uint8_t>(8);
    if (type == 1)
    {
        streamPID = reader.getBits<int>(16);
        reader.skipBits(32);
        reader.skipBits(16);
    }
    else if (type == 2)
    {
        reader.skipBits(16);  // ref_to_SubPath_id, ref_to_subClip_entry_id
        streamPID = reader.getBits<int>(16);
        reader.skipBits(32);
    }
    else if (type == 3 || type == 4)
    {
        reader.skipBits(8);  // ref_to_SubPath_id
        streamPID = reader.getBits<int>(16);
        reader.skipBits(32);
        reader.skipBits(8);
    }
}